

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix_asQuat
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  Vector *this_00;
  float fVar1;
  KFLOAT32 KVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  
  dVar5 = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude) * 0.5;
  dVar6 = sin(dVar5);
  fVar1 = (float)dVar6;
  this_00 = &this->m_quatAxis;
  KVar2 = DATA_TYPE::Vector::GetX(this_00);
  fVar3 = (float)KVar2 * fVar1;
  KVar2 = DATA_TYPE::Vector::GetY(this_00);
  fVar4 = (float)KVar2 * fVar1;
  KVar2 = DATA_TYPE::Vector::GetZ(this_00);
  fVar1 = (float)KVar2 * fVar1;
  dVar5 = cos(dVar5);
  fVar7 = (float)dVar5;
  fVar8 = fVar7 * fVar7;
  res->Data[0][0] = fVar3 * fVar3 + fVar8 + -0.5;
  res->Data[0][1] = fVar3 * fVar4 - fVar1 * fVar7;
  res->Data[0][2] = fVar3 * fVar1 + fVar4 * fVar7;
  res->Data[1][0] = fVar3 * fVar4 + fVar1 * fVar7;
  res->Data[1][1] = fVar4 * fVar4 + fVar8 + -0.5;
  res->Data[1][2] = fVar4 * fVar1 - fVar3 * fVar7;
  res->Data[2][0] = fVar3 * fVar1 - fVar4 * fVar7;
  res->Data[2][1] = fVar4 * fVar1 + fVar3 * fVar7;
  res->Data[2][2] = fVar1 * fVar1 + fVar8 + -0.5;
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix_asQuat( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    // to be implemented
    // assume that m_quatAxis is set
    KFLOAT32 qx, qy, qz;
    KFLOAT32 q0;
    const KFLOAT64 beta = totalTimeSinceReset * m_f64Magnitude;

    KFLOAT32 sin_beta_2 = sin(beta/2.0f);
    qx = sin_beta_2 * m_quatAxis.GetX();
    qy = sin_beta_2 * m_quatAxis.GetY();
    qz = sin_beta_2 * m_quatAxis.GetZ();
    q0 = cos(beta/2.0f);

    res.Data[0][0] = q0*q0 + qx*qx - 0.5f;
    res.Data[0][1] = qx*qy - q0*qz;
    res.Data[0][2] = qx*qz + q0*qy;

    res.Data[1][0] = qx*qy + q0*qz;
    res.Data[1][1] = q0*q0 + qy*qy - 0.5f;
    res.Data[1][2] = qy*qz - q0*qx;

    res.Data[2][0] = qx*qz - q0*qy;
    res.Data[2][1] = qy*qz + q0*qx;
    res.Data[2][2] = q0*q0 + qz*qz - 0.5f;
}